

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void (anonymous_namespace)::test_assignment_from_rational<unsigned_short,unsigned_short>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_short_&> EVar3;
  int local_5e0;
  value_type_conflict4 local_5da;
  ExpressionLhs<const_unsigned_short_&> local_5d8;
  SourceLineInfo local_5c8;
  undefined1 local_5a0 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_unsigned_short_&> local_2f8 [2];
  SourceLineInfo local_2d8;
  undefined1 local_2b0 [8];
  ResultBuilder __catchResult;
  rational1 r;
  
  tcb::rational<unsigned_short>::rational
            ((rational<unsigned_short> *)&__catchResult.field_0x29c,1,10);
  tcb::rational<unsigned_short>::rational
            ((rational<unsigned_short> *)&__catchResult.m_shouldDebugBreak,3,2);
  __catchResult._668_1_ = __catchResult.m_shouldDebugBreak;
  __catchResult._669_1_ = __catchResult.m_shouldThrow;
  __catchResult._670_2_ = __catchResult._666_2_;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x68);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b0,"REQUIRE",&local_2d8,"r.num() == 3",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2d8);
    __catchResult_1._670_2_ =
         tcb::rational<unsigned_short>::num((rational<unsigned_short> *)&__catchResult.field_0x29c);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2b0,(unsigned_short *)&__catchResult_1.field_0x29e);
    __catchResult_1.m_shouldDebugBreak = true;
    __catchResult_1.m_shouldThrow = false;
    __catchResult_1._666_2_ = 0;
    local_2f8[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_short_const&>::operator==
                       ((ExpressionLhs<unsigned_short_const&> *)local_2f8,
                        (int *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x69);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a0,"REQUIRE",&local_5c8,"r.denom() == 2",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_5c8);
    local_5da = tcb::rational<unsigned_short>::denom
                          ((rational<unsigned_short> *)&__catchResult.field_0x29c);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5a0,&local_5da);
    local_5e0 = 2;
    local_5d8 = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_short_const&>::operator==
                       ((ExpressionLhs<unsigned_short_const&> *)&local_5d8,&local_5e0);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_assignment_from_rational()
{
    using rational1 = tcb::rational<T>;
    using rational2 = tcb::rational<U>;

    rational1 r{1, 10};
    r = rational2{3, 2};
    REQUIRE(r.num() == 3);
    REQUIRE(r.denom() == 2);
}